

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O0

void __thiscall TrodesMsg::appendArg(TrodesMsg *this,char c,uint8_t a)

{
  string *this_00;
  byte in_DL;
  char in_SIL;
  long in_RDI;
  allocator local_b [11];
  
  if (in_SIL != '1') {
    this_00 = (string *)__cxa_allocate_exception(0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (this_00,"Could not append to msg. Expected a different type, got uint8",local_b);
    __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  zmsg_addstrf(*(zmsg_t **)(in_RDI + 0x20),"%u",(ulong)in_DL);
  return;
}

Assistant:

void TrodesMsg::appendArg (const char c, const uint8_t a){
    if(c != '1') throw std::string(APPENDERROR "uint8");
    zmsg_addstrf (msg, "%" PRIu8, a);
}